

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void __thiscall
SQLite::Database::Database
          (Database *this,char *apFilename,int aFlags,int aBusyTimeoutMs,char *apVfs)

{
  int iVar1;
  Exception *this_00;
  sqlite3 *handle;
  allocator local_31;
  pointer local_30;
  
  (this->mSQLitePtr)._M_t.super___uniq_ptr_impl<sqlite3,_SQLite::Database::Deleter>._M_t.
  super__Tuple_impl<0UL,_sqlite3_*,_SQLite::Database::Deleter>.
  super__Head_base<0UL,_sqlite3_*,_false>._M_head_impl = (sqlite3 *)0x0;
  std::__cxx11::string::string((string *)&this->mFilename,apFilename,&local_31);
  iVar1 = sqlite3_open_v2(apFilename,&local_30,aFlags,apVfs);
  std::__uniq_ptr_impl<sqlite3,_SQLite::Database::Deleter>::reset
            ((__uniq_ptr_impl<sqlite3,_SQLite::Database::Deleter> *)this,local_30);
  if (iVar1 == 0) {
    if (0 < aBusyTimeoutMs) {
      iVar1 = sqlite3_busy_timeout
                        ((this->mSQLitePtr)._M_t.
                         super___uniq_ptr_impl<sqlite3,_SQLite::Database::Deleter>._M_t.
                         super__Tuple_impl<0UL,_sqlite3_*,_SQLite::Database::Deleter>.
                         super__Head_base<0UL,_sqlite3_*,_false>._M_head_impl,aBusyTimeoutMs);
      check(this,iVar1);
    }
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,local_30,iVar1);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Database::Database(const char* apFilename,
                   const int   aFlags         /* = SQLite::OPEN_READONLY*/,
                   const int   aBusyTimeoutMs /* = 0 */,
                   const char* apVfs          /* = nullptr*/) :
    mFilename(apFilename)
{
    sqlite3* handle;
    const int ret = sqlite3_open_v2(apFilename, &handle, aFlags, apVfs);
    mSQLitePtr.reset(handle);
    if (SQLITE_OK != ret)
    {
        throw SQLite::Exception(handle, ret);
    }
    if (aBusyTimeoutMs > 0)
    {
        setBusyTimeout(aBusyTimeoutMs);
    }
}